

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmatrix.h
# Opt level: O1

int __thiscall gmath::DMatrix<double>::init(DMatrix<double> *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long in_RAX;
  long extraout_RAX;
  double *__s;
  ulong uVar4;
  int in_EDX;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if (this->v != (double *)0x0) {
    operator_delete__(this->v);
    in_RAX = extraout_RAX;
  }
  this->nrows = (int)ctx;
  this->ncols = in_EDX;
  uVar5 = (int)ctx * in_EDX;
  this->n = uVar5;
  this->v = (double *)0x0;
  if (0 < (int)uVar5) {
    uVar7 = (ulong)uVar5;
    __s = (double *)operator_new__(uVar7 * 8);
    this->v = __s;
    lVar6 = 0;
    memset(__s,0,uVar7 * 8);
    auVar3 = _DAT_0010e140;
    auVar2 = _DAT_0010e130;
    uVar4 = (long)in_EDX + 1;
    if ((long)uVar7 < (long)uVar4) {
      uVar7 = uVar4;
    }
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar4;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar7 - 1;
    auVar1 = auVar1 / auVar10;
    auVar8._8_4_ = auVar1._0_4_;
    auVar8._0_8_ = auVar1._0_8_;
    auVar8._12_4_ = auVar1._4_4_;
    in_RAX = (auVar1._0_8_ & 0xfffffffffffffffe) + 2;
    auVar8 = auVar8 ^ _DAT_0010e140;
    do {
      auVar9._8_4_ = (int)lVar6;
      auVar9._0_8_ = lVar6;
      auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar10 = (auVar9 | auVar2) ^ auVar3;
      if ((bool)(~(auVar10._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar10._0_4_ ||
                  auVar8._4_4_ < auVar10._4_4_) & 1)) {
        *__s = 1.0;
      }
      if ((auVar10._12_4_ != auVar8._12_4_ || auVar10._8_4_ <= auVar8._8_4_) &&
          auVar10._12_4_ <= auVar8._12_4_) {
        __s[uVar4] = 1.0;
      }
      lVar6 = lVar6 + 2;
      __s = __s + uVar4 * 2;
    } while (in_RAX != lVar6);
  }
  return (int)in_RAX;
}

Assistant:

void init(int rows=0, int cols=0)
    {
      if (v != 0)
      {
        delete [] v;
      }

      nrows=rows;
      ncols=cols;
      n=nrows*ncols;

      v=0;

      if (n > 0)
      {
        v=new T[n];

        for (int i=0; i<n; i++)
        {
          v[i]=0;
        }

        for (int i=0; i<n; i+=cols+1)
        {
          v[i]=1;
        }
      }
    }